

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

optional<unsigned_int> __thiscall wasm::WATParser::Lexer::takeAlign(Lexer *this)

{
  bool bVar1;
  int iVar2;
  optional<unsigned_int> oVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  string_view in;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  basic_string_view<char,_std::char_traits<char>_> __y;
  undefined1 local_b8 [8];
  Lexer subLexer;
  undefined1 local_38 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> result;
  
  in = next(this);
  anon_unknown_0::keyword
            ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_38,in);
  if (result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
      _M_payload._8_1_ == '\x01') {
    bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_38,0,6);
    __y._M_str = "align=";
    __y._M_len = 6;
    bVar1 = std::operator!=(bVar7,__y);
    if (bVar1) {
      return (_Optional_base<unsigned_int,_true,_true>)
             (_Optional_payload<unsigned_int,_true,_true,_true>)0x0;
    }
    bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_38,6,
                       0xffffffffffffffff);
    Lexer((Lexer *)local_b8,bVar7,
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&subLexer.buffer._M_str);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&subLexer.buffer._M_str);
    oVar3 = takeU<unsigned_int>((Lexer *)local_b8);
    if (((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) {
      iVar2 = Bits::popCount(oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                             super__Optional_payload_base<unsigned_int>._M_payload);
      if (iVar2 == 1) {
        this->pos = this->pos + (long)local_38;
        advance(this);
        uVar4 = (ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int> & 0xffffff0000000000;
        uVar5 = (ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int> & 0xff00000000;
        uVar6 = (ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int> & 0xffffffff;
      }
      else {
        uVar6 = 0;
        uVar5 = 0;
        uVar4 = 0;
      }
      ~Lexer((Lexer *)local_b8);
      return (_Optional_base<unsigned_int,_true,_true>)
             (_Optional_base<unsigned_int,_true,_true>)(uVar6 | uVar5 | uVar4);
    }
    ~Lexer((Lexer *)local_b8);
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_payload<unsigned_int,_true,_true,_true>)0x0;
}

Assistant:

std::optional<uint32_t> Lexer::takeAlign() {
  if (auto result = keyword(next())) {
    if (result->span.substr(0, 6) != "align="sv) {
      return std::nullopt;
    }
    Lexer subLexer(result->span.substr(6));
    if (auto o = subLexer.takeU32()) {
      if (Bits::popCount(*o) != 1) {
        return std::nullopt;
      }
      pos += result->span.size();
      advance();
      return o;
    }
  }
  return std::nullopt;
}